

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_eret_mipsel(CPUMIPSState_conflict2 *env)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  target_ulong_conflict *ptVar4;
  
  uVar1 = env->CP0_Status;
  uVar3 = uVar1 & 4;
  ptVar4 = &env->CP0_ErrorEPC;
  if (uVar3 == 0) {
    ptVar4 = &env->CP0_EPC;
  }
  uVar2 = *ptVar4;
  (env->active_tc).PC = uVar2 & 0xfffffffe;
  env->hflags = (uVar2 & 1) << 10 | env->hflags & 0xfffffbff;
  env->CP0_Status = (uVar3 >> 1 | 0xfffffff9) & uVar1;
  compute_hflags(env);
  env->CP0_LLAddr = 1;
  env->lladdr = 1;
  return;
}

Assistant:

void helper_eret(CPUMIPSState *env)
{
    exception_return(env);
    env->CP0_LLAddr = 1;
    env->lladdr = 1;
}